

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int lemon_sprintf(char *str,char *format,...)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  bool bVar4;
  char in_AL;
  uint uVar5;
  int extraout_EAX;
  ushort **ppuVar6;
  uint *puVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *str_00;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  undefined8 in_RCX;
  int iVar15;
  int __type;
  undefined8 in_RDX;
  uint *puVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  byte *pbVar20;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int nUsed;
  va_list ap;
  char zTemp [50];
  byte local_174 [4];
  uint *local_170;
  char *local_168;
  ulong local_160;
  undefined8 local_158;
  uint *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  byte abStack_f7 [15];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_148 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar16 = (uint *)&stack0x00000008;
  local_158 = 0x3000000010;
  local_174[0] = 0;
  local_174[1] = 0;
  local_174[2] = 0;
  local_174[3] = 0;
  *str = '\0';
  local_160 = 0x10;
  local_138 = format + 1;
  iVar15 = 0;
  pcVar9 = format + 2;
  local_150 = puVar16;
  local_140 = local_148;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    lVar22 = (long)iVar15;
    lVar18 = 0;
    while( true ) {
      iVar17 = (int)lVar18;
      if (pcVar9[lVar18 + lVar22 + -2] == '\0') {
        lemon_addtext(str,(int *)local_174,format + lVar22,iVar17,0);
        return extraout_EAX;
      }
      if (pcVar9[lVar18 + lVar22 + -2] == '%') break;
      lVar18 = lVar18 + 1;
    }
    pbVar20 = local_174;
    local_170 = puVar16;
    local_168 = str;
    local_130 = pcVar9;
    lemon_addtext(str,(int *)pbVar20,format + lVar22,iVar17,0);
    uVar23 = (ulong)(iVar15 + 1) + lVar18;
    uVar21 = (uint)uVar23;
    bVar1 = format[(int)uVar21];
    uVar8 = (ulong)bVar1;
    ppuVar6 = __ctype_b_loc();
    pcVar12 = local_168;
    puVar3 = *ppuVar6;
    if ((*(byte *)((long)puVar3 + uVar8 * 2 + 1) & 8) == 0) {
      if (bVar1 == 0x2d) {
        if ((*(byte *)((long)puVar3 + (ulong)(byte)pcVar9[lVar18 + lVar22] * 2 + 1) & 8) != 0)
        goto LAB_0010a73a;
        break;
      }
      iVar17 = 0;
    }
    else {
LAB_0010a73a:
      uVar23 = uVar23 & 0xffffffff;
      if (bVar1 == 0x2d) {
        uVar23 = (ulong)(uint)(iVar15 + 2 + iVar17);
      }
      uVar21 = (uint)uVar23;
      pbVar20 = (byte *)(long)(int)uVar21;
      uVar8 = (ulong)(byte)format[(long)pbVar20];
      iVar15 = 0;
      if ((*(byte *)((long)puVar3 + uVar8 * 2 + 1) & 8) != 0) {
        pbVar20 = pbVar20 + (long)local_138;
        iVar15 = 0;
        do {
          iVar15 = (int)(char)uVar8 + iVar15 * 10 + -0x30;
          uVar8 = (ulong)*pbVar20;
          uVar21 = (int)uVar23 + 1;
          uVar23 = (ulong)uVar21;
          pbVar20 = pbVar20 + 1;
        } while ((*(byte *)((long)puVar3 + uVar8 * 2 + 1) & 8) != 0);
      }
      iVar17 = -iVar15;
      if (bVar1 != 0x2d) {
        iVar17 = iVar15;
      }
    }
    uVar14 = (uint)uVar8;
    uVar19 = (uint)local_160;
    puVar16 = local_170;
    if (uVar14 < 100) {
      if (uVar14 != 0x25) {
        if ((uVar14 == 0x2e) &&
           (format[(long)(int)uVar21 + 2] == 's' && *(short *)(format + (int)uVar21) == 0x2a2e)) {
          if (uVar19 < 0x29) {
            uVar8 = local_160 & 0xffffffff;
            uVar5 = uVar19 + 8;
            local_160 = (ulong)uVar5;
            local_158 = CONCAT44(local_158._4_4_,uVar5);
            uVar14 = *(uint *)(local_140 + uVar8);
            puVar7 = local_170;
            if (0x20 < uVar19) goto LAB_0010a999;
            puVar7 = (uint *)(local_140 + uVar5);
            local_160 = (ulong)(uVar19 + 0x10);
            local_158 = CONCAT44(local_158._4_4_,uVar19 + 0x10);
          }
          else {
            uVar14 = *local_170;
            puVar7 = local_170 + 2;
LAB_0010a999:
            puVar16 = puVar7 + 2;
            local_150 = puVar16;
          }
          uVar21 = uVar21 + 2;
          pbVar20 = *(byte **)puVar7;
          goto LAB_0010a9b1;
        }
        break;
      }
      lemon_addtext(local_168,(int *)local_174,"%",1,0);
      puVar16 = local_170;
    }
    else {
      if (uVar14 == 0x73) {
        if (uVar19 < 0x29) {
          uVar8 = local_160 & 0xffffffff;
          local_160 = (ulong)(uVar19 + 8);
          local_158 = CONCAT44(local_158._4_4_,uVar19 + 8);
          puVar7 = (uint *)(local_140 + uVar8);
        }
        else {
          puVar16 = local_170 + 2;
          puVar7 = local_170;
          local_150 = puVar16;
        }
        pbVar20 = *(byte **)puVar7;
        uVar14 = 0xffffffff;
      }
      else {
        if (uVar14 != 100) break;
        if (uVar19 < 0x29) {
          uVar8 = local_160 & 0xffffffff;
          local_160 = (ulong)(uVar19 + 8);
          local_158 = CONCAT44(local_158._4_4_,uVar19 + 8);
          puVar7 = (uint *)(local_140 + uVar8);
        }
        else {
          puVar16 = local_170 + 2;
          puVar7 = local_170;
          local_150 = puVar16;
        }
        uVar14 = *puVar7;
        if ((int)uVar14 < 0) {
          lemon_addtext(local_168,(int *)local_174,"-",1,iVar17);
          uVar14 = -uVar14;
LAB_0010a940:
          lVar18 = 0;
          do {
            abStack_f7[lVar18] = (char)uVar14 + (char)(uVar14 / 10) * -10 | 0x30;
            lVar18 = lVar18 + -1;
            bVar4 = 9 < uVar14;
            uVar14 = uVar14 / 10;
          } while (bVar4);
          uVar14 = -(int)lVar18;
          pcVar12 = local_168;
        }
        else {
          if (uVar14 != 0) goto LAB_0010a940;
          lemon_addtext(local_168,(int *)local_174,"0",1,iVar17);
          uVar14 = 0;
        }
        pbVar20 = abStack_f7 + (1 - (ulong)uVar14);
      }
LAB_0010a9b1:
      lemon_addtext(pcVar12,(int *)local_174,(char *)pbVar20,uVar14,iVar17);
    }
    iVar15 = uVar21 + 1;
    pcVar9 = local_130;
    str = pcVar12;
  } while( true );
  lemon_sprintf_cold_1();
  pcVar9 = strrchr(str,0x2f);
  if (pcVar9 == (char *)0x0) {
    pcVar12 = getenv("PATH");
    pcVar9 = ".:/bin:/usr/bin";
    if (pcVar12 != (char *)0x0) {
      pcVar9 = pcVar12;
    }
    sVar10 = strlen(pcVar9);
    pcVar13 = (char *)malloc((long)((int)sVar10 + 1));
    sVar11 = strlen((char *)pbVar20);
    str_00 = (char *)malloc((long)(((ulong)(uint)((int)sVar10 + (int)sVar11) << 0x20) + 0x200000000)
                            >> 0x20);
    pcVar12 = (char *)0x0;
    if ((pcVar13 != (char *)0x0) && (str_00 != (char *)0x0)) {
      lVar18 = 0;
      do {
        cVar2 = pcVar9[lVar18];
        pcVar13[lVar18] = cVar2;
        lVar18 = lVar18 + 1;
        __s = pcVar13;
      } while (cVar2 != '\0');
      do {
        pcVar12 = pcVar13;
        if (*__s == '\0') break;
        pcVar9 = strchr(__s,0x3a);
        if (pcVar9 == (char *)0x0) {
          sVar10 = strlen(__s);
          pcVar9 = __s + (int)sVar10;
        }
        cVar2 = *pcVar9;
        *pcVar9 = '\0';
        lemon_sprintf(str_00,"%s/%s",__s,pbVar20);
        *pcVar9 = cVar2;
        if (cVar2 == '\0') {
          *__s = '\0';
        }
        else {
          __s = pcVar9 + 1;
        }
        iVar15 = access(str_00,__type);
      } while (iVar15 != 0);
    }
    free(pcVar12);
  }
  else {
    cVar2 = *pcVar9;
    *pcVar9 = '\0';
    sVar10 = strlen(str);
    sVar11 = strlen((char *)pbVar20);
    str_00 = (char *)malloc((long)(((ulong)(uint)((int)sVar10 + (int)sVar11) << 0x20) + 0x200000000)
                            >> 0x20);
    if (str_00 != (char *)0x0) {
      lemon_sprintf(str_00,"%s/%s",str,pbVar20);
    }
    *pcVar9 = cVar2;
  }
  return (int)str_00;
}

Assistant:

static int lemon_sprintf(char *str, const char *format, ...){
  va_list ap;
  int rc;
  va_start(ap, format);
  rc = lemon_vsprintf(str, format, ap);
  va_end(ap);
  return rc;
}